

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell::createTest
          (TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_TestShell *this)

{
  TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_Test *this_00;
  
  this_00 = (TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
                         ,0x96);
  TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_Test::
  TEST_MockCheckedActualCall_MockIgnoredActualCallWorksAsItShould_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockCheckedActualCall, MockIgnoredActualCallWorksAsItShould)
{
    MockIgnoredActualCall actual;
    actual.withName("func");
    actual.withCallOrder(1);

    CHECK(false == actual.returnBoolValue());
    CHECK(true == actual.returnBoolValueOrDefault(true));
    CHECK(false == actual.returnBoolValueOrDefault(false));
    CHECK(0 == actual.returnUnsignedLongIntValue());
    CHECK(0 == actual.returnIntValue());
    CHECK(1ul == actual.returnUnsignedLongIntValueOrDefault(1ul));
    CHECK(1 == actual.returnIntValueOrDefault(1));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(1l == actual.returnLongIntValueOrDefault(1l));
    CHECK(0 == actual.returnUnsignedIntValue());
    CHECK(1u == actual.returnUnsignedIntValueOrDefault(1u));
#if CPPUTEST_USE_LONG_LONG
    CHECK(0 == actual.returnLongLongIntValue());
    CHECK(1ll == actual.returnLongLongIntValueOrDefault(1ll));
    CHECK(0 == actual.returnUnsignedLongLongIntValue());
    CHECK(1ull == actual.returnUnsignedLongLongIntValueOrDefault(1ull));
#endif
    DOUBLES_EQUAL(0.0, actual.returnDoubleValue(), 0.0);
    DOUBLES_EQUAL(1.5, actual.returnDoubleValueOrDefault(1.5), 0.0);
    STRCMP_EQUAL("bla", actual.returnStringValueOrDefault("bla"));
    STRCMP_EQUAL("", actual.returnStringValue());
    CHECK(NULLPTR == actual.returnPointerValue());
    CHECK((void*) 0x2 == actual.returnPointerValueOrDefault((void*) 0x2));
    CHECK(NULLPTR == actual.returnConstPointerValue());
    CHECK((const void*) 0x2 == actual.returnConstPointerValueOrDefault((const void*) 0x2));
    CHECK(NULLPTR == actual.returnFunctionPointerValue());
    CHECK((void(*)()) 1 == actual.returnFunctionPointerValueOrDefault((void(*)()) 0x1));
    CHECK_FALSE(actual.hasReturnValue());
    CHECK(actual.returnValue().equals(MockNamedValue("")));
}